

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O3

QByteArray * __thiscall QByteArray::operator=(QByteArray *this,char *str)

{
  int iVar1;
  QArrayData *data;
  long lVar2;
  long lVar3;
  long in_FS_OFFSET;
  QByteArrayView v;
  QArrayDataPointer<char> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (str == (char *)0x0) {
    data = &((this->d).d)->super_QArrayData;
    (this->d).d = (Data *)0x0;
    (this->d).ptr = (char *)0x0;
    (this->d).size = 0;
    if (data == (QArrayData *)0x0) goto LAB_003007bd;
    LOCK();
    (data->ref_)._q_value.super___atomic_base<int>._M_i =
         (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    iVar1 = (data->ref_)._q_value.super___atomic_base<int>._M_i;
    UNLOCK();
  }
  else {
    if (*str != '\0') {
      lVar3 = -1;
      do {
        lVar2 = lVar3 + 1;
        lVar3 = lVar3 + 1;
      } while (str[lVar2] != '\0');
      v.m_data = str;
      v.m_size = lVar3;
      assign(this,v);
      goto LAB_003007bd;
    }
    local_30.d = (Data *)0x0;
    local_30.ptr = &_empty;
    local_30.size = 0;
    QArrayDataPointer<char>::operator=(&this->d,&local_30);
    if (&(local_30.d)->super_QArrayData == (QArrayData *)0x0) goto LAB_003007bd;
    LOCK();
    ((local_30.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_30.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    iVar1 = ((local_30.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    UNLOCK();
    data = &(local_30.d)->super_QArrayData;
  }
  if (iVar1 == 0) {
    QArrayData::deallocate(data,1,0x10);
  }
LAB_003007bd:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray &QByteArray::operator=(const char *str)
{
    if (!str) {
        d.clear();
    } else if (!*str) {
        d = DataPointer::fromRawData(&_empty, 0);
    } else {
        assign(str);
    }
    return *this;
}